

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_2badaf::check<long>(istream *is,long c)

{
  char in_RAX [8];
  ostream *poVar1;
  char b [8];
  
  b = in_RAX;
  std::istream::read((char *)is,(long)b);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           __DeepScanLineInputFile + (*__DeepScanLineInputFile == '*'));
  poVar1 = std::operator<<(poVar1,": expected ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,", got ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (((ulong)b & 0xff00000000000000 |
      ((ulong)b >> 0x30 & 0xff) << 0x30 |
      ((ulong)b >> 0x28 & 0xff) << 0x28 |
      ((ulong)b >> 0x20 & 0xff) << 0x20 |
      ((ulong)b >> 0x18 & 0xff) << 0x18 |
      ((ulong)b >> 0x10 & 0xff) << 0x10 | ((ulong)b >> 8 & 0xff) << 8 | (ulong)b & 0xff) == c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = long]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}